

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_set_from_axisf3_angle_EXP(matrix4 *self,float x,float y,float z,float angle)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  dVar1 = cos((double)angle);
  fVar2 = (float)dVar1;
  dVar1 = sin((double)angle);
  fVar3 = (float)dVar1;
  fVar4 = 1.0 - fVar2;
  *(ulong *)&self->field_0 = CONCAT44(y * x * fVar4 + -(fVar3 * z),x * x * fVar4 + fVar2);
  *(ulong *)((long)&self->field_0 + 0x10) =
       CONCAT44(y * y * fVar4 + fVar2,y * x * fVar4 + fVar3 * z);
  *(ulong *)((long)&self->field_0 + 0x20) =
       CONCAT44(fVar4 * z * y + fVar3 * x,fVar4 * z * x + -(fVar3 * y));
  (self->field_0).m[2] = z * x * fVar4 + fVar3 * y;
  (self->field_0).m[6] = z * y * fVar4 - fVar3 * x;
  (self->field_0).m[10] = z * z * fVar4 + fVar2;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[7] = 0.0;
  *(undefined8 *)((long)&self->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x34) = 0;
  (self->field_0).m[0xf] = 1.0;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_set_from_axisf3_angle_EXP(struct matrix4 *self, HYP_FLOAT x, HYP_FLOAT y, HYP_FLOAT z, const HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	self->c00 = (x * x) * (1.0f - c) + c;
	self->c01 = (x * y) * (1.0f - c) + (z * s);
	self->c02 = (x * z) * (1.0f - c) - (y * s);
	self->c03 = 0.0f;

	self->c10 = (y * x) * (1.0f - c) - (z * s);
	self->c11 = (y * y) * (1.0f - c) + c;
	self->c12 = (y * z) * (1.0f - c) + (x * s);
	self->c13 = 0.0f;

	self->c20 = (z * x) * (1.0f - c) + (y * s);
	self->c21 = (z * y) * (1.0f - c) - (x * s);
	self->c22 = (z * z) * (1.0f - c) + c;
	self->c23 = 0.0f;

	self->c30 = 0.0f;
	self->c31 = 0.0f;
	self->c32 = 0.0f;
	self->c33 = 1.0f;

	return self;
}